

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUVStreambuf.h
# Opt level: O0

void __thiscall
cmBasicUVStreambuf<char,_std::char_traits<char>_>::StreamReadStartStop
          (cmBasicUVStreambuf<char,_std::char_traits<char>_> *this)

{
  uv_stream_t *stream;
  ulong uVar1;
  ulong uVar2;
  _func_void_uv_handle_t_ptr_size_t_uv_buf_t_ptr *alloc_cb;
  _func_void_uv_stream_t_ptr_ssize_t_uv_buf_t_ptr *read_cb;
  _lambda_uv_stream_s__long_uv_buf_t_const___1_ local_12;
  _lambda_uv_handle_s__unsigned_long_uv_buf_t___1_ local_11;
  cmBasicUVStreambuf<char,_std::char_traits<char>_> *local_10;
  cmBasicUVStreambuf<char,_std::char_traits<char>_> *this_local;
  
  if (this->Stream != (uv_stream_t *)0x0) {
    local_10 = this;
    uv_read_stop(this->Stream);
    uVar1 = std::streambuf::gptr();
    uVar2 = std::streambuf::egptr();
    if (uVar2 <= uVar1) {
      stream = this->Stream;
      alloc_cb = ::cmBasicUVStreambuf::StreamReadStartStop()::
                 {lambda(uv_handle_s*,unsigned_long,uv_buf_t*)#1}::operator_cast_to_function_pointer
                           (&local_11);
      read_cb = ::cmBasicUVStreambuf::StreamReadStartStop()::
                {lambda(uv_stream_s*,long,uv_buf_t_const*)#1}::operator_cast_to_function_pointer
                          (&local_12);
      uv_read_start(stream,alloc_cb,read_cb);
    }
  }
  return;
}

Assistant:

void cmBasicUVStreambuf<CharT, Traits>::StreamReadStartStop()
{
  if (this->Stream) {
    uv_read_stop(this->Stream);
    if (this->gptr() >= this->egptr()) {
      uv_read_start(
        this->Stream,
        [](uv_handle_t* handle, size_t /* unused */, uv_buf_t* buf) {
          auto streambuf =
            static_cast<cmBasicUVStreambuf<CharT, Traits>*>(handle->data);
          streambuf->HandleAlloc(buf);
        },
        [](uv_stream_t* stream2, ssize_t nread, const uv_buf_t* /* unused */) {
          auto streambuf =
            static_cast<cmBasicUVStreambuf<CharT, Traits>*>(stream2->data);
          streambuf->StreamRead(nread);
        });
    }
  }
}